

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeToPDFForm.cpp
# Opt level: O0

int MergeToPDFForm(int argc,char **argv)

{
  PDFDocumentCopyingContext *pPVar1;
  undefined8 uVar2;
  EncryptionOptions *pEVar3;
  PDFPage *this;
  PDFParsingOptions *inOptions;
  PDFFormXObject *this_00;
  XObjectContentContext *this_01;
  ObjectIDType inFormXObjectID;
  ResourcesDictionary *this_02;
  bool bVar4;
  undefined1 local_1128 [8];
  string formName;
  PageContentContext *pageContentContext;
  ObjectIDType formID;
  XObjectContentContext *xobjectContentContext;
  PDFFormXObject *local_10d0;
  PDFFormXObject *newFormXObject;
  string local_10c0;
  string local_10a0;
  PDFRectangle local_1080;
  PDFPage *local_1060;
  PDFPage *page;
  PDFCreationSettings local_1008;
  allocator<char> local_fa1;
  string local_fa0;
  string local_f80;
  LogConfiguration local_f60;
  allocator<char> local_f19;
  string local_f18;
  string local_ef8;
  PDFDocumentCopyingContext *local_ed8;
  PDFDocumentCopyingContext *copyingContext;
  undefined1 local_ec8 [4];
  EStatusCode status;
  PDFWriter pdfWriter;
  char **argv_local;
  int argc_local;
  
  pdfWriter._3752_8_ = argv;
  PDFWriter::PDFWriter((PDFWriter *)local_ec8);
  uVar2 = pdfWriter._3752_8_;
  local_ed8 = (PDFDocumentCopyingContext *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f18,"MergeToPDFForm.pdf",&local_f19);
  BuildRelativeOutputPath(&local_ef8,(char **)uVar2,&local_f18);
  uVar2 = pdfWriter._3752_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_fa0,"MergeToPDFForm.txt",&local_fa1);
  BuildRelativeOutputPath(&local_f80,(char **)uVar2,&local_fa0);
  LogConfiguration::LogConfiguration(&local_f60,true,true,&local_f80);
  pEVar3 = EncryptionOptions::DefaultEncryptionOptions();
  EncryptionOptions::EncryptionOptions((EncryptionOptions *)&page,pEVar3);
  PDFCreationSettings::PDFCreationSettings(&local_1008,true,true,(EncryptionOptions *)&page,false);
  copyingContext._4_4_ =
       PDFWriter::StartPDF((PDFWriter *)local_ec8,&local_ef8,ePDFVersion13,&local_f60,&local_1008);
  PDFCreationSettings::~PDFCreationSettings(&local_1008);
  EncryptionOptions::~EncryptionOptions((EncryptionOptions *)&page);
  LogConfiguration::~LogConfiguration(&local_f60);
  std::__cxx11::string::~string((string *)&local_f80);
  std::__cxx11::string::~string((string *)&local_fa0);
  std::allocator<char>::~allocator(&local_fa1);
  std::__cxx11::string::~string((string *)&local_ef8);
  std::__cxx11::string::~string((string *)&local_f18);
  std::allocator<char>::~allocator(&local_f19);
  if (copyingContext._4_4_ == eSuccess) {
    this = (PDFPage *)operator_new(0x2b8);
    PDFPage::PDFPage(this);
    local_1060 = this;
    PDFRectangle::PDFRectangle(&local_1080,0.0,0.0,595.0,842.0);
    PDFPage::SetMediaBox(this,&local_1080);
    PDFRectangle::~PDFRectangle(&local_1080);
    uVar2 = pdfWriter._3752_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_10c0,"Linearized.pdf",(allocator<char> *)((long)&newFormXObject + 7)
              );
    BuildRelativeInputPath(&local_10a0,(char **)uVar2,&local_10c0);
    inOptions = PDFParsingOptions::DefaultPDFParsingOptions();
    local_ed8 = PDFWriter::CreatePDFCopyingContext((PDFWriter *)local_ec8,&local_10a0,inOptions);
    std::__cxx11::string::~string((string *)&local_10a0);
    std::__cxx11::string::~string((string *)&local_10c0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&newFormXObject + 7));
    if (copyingContext._4_4_ == eSuccess) {
      PDFRectangle::PDFRectangle((PDFRectangle *)&xobjectContentContext,0.0,0.0,297.5,842.0);
      this_00 = PDFWriter::StartFormXObject
                          ((PDFWriter *)local_ec8,(PDFRectangle *)&xobjectContentContext,
                           (double *)0x0);
      PDFRectangle::~PDFRectangle((PDFRectangle *)&xobjectContentContext);
      local_10d0 = this_00;
      if (this_00 == (PDFFormXObject *)0x0) {
        copyingContext._4_4_ = eFailure;
      }
      else {
        this_01 = PDFFormXObject::GetContentContext(this_00);
        AbstractContentContext::q(&this_01->super_AbstractContentContext);
        AbstractContentContext::cm(&this_01->super_AbstractContentContext,0.5,0.0,0.0,0.5,0.0,0.0);
        copyingContext._4_4_ =
             PDFDocumentCopyingContext::MergePDFPageToFormXObject(local_ed8,local_10d0,1);
        if (copyingContext._4_4_ == eSuccess) {
          AbstractContentContext::Q(&this_01->super_AbstractContentContext);
          AbstractContentContext::q(&this_01->super_AbstractContentContext);
          AbstractContentContext::cm
                    (&this_01->super_AbstractContentContext,0.5,0.0,0.0,0.5,0.0,421.0);
          copyingContext._4_4_ =
               PDFDocumentCopyingContext::MergePDFPageToFormXObject(local_ed8,local_10d0,0);
          if (copyingContext._4_4_ == eSuccess) {
            AbstractContentContext::Q(&this_01->super_AbstractContentContext);
            inFormXObjectID = PDFFormXObject::GetObjectID(local_10d0);
            copyingContext._4_4_ =
                 PDFWriter::EndFormXObjectAndRelease((PDFWriter *)local_ec8,local_10d0);
            if (copyingContext._4_4_ == eSuccess) {
              formName.field_2._8_8_ =
                   PDFWriter::StartPageContentContext((PDFWriter *)local_ec8,local_1060);
              this_02 = PDFPage::GetResourcesDictionary(local_1060);
              ResourcesDictionary::AddFormXObjectMapping_abi_cxx11_
                        ((string *)local_1128,this_02,inFormXObjectID);
              AbstractContentContext::q((AbstractContentContext *)formName.field_2._8_8_);
              AbstractContentContext::Do
                        ((AbstractContentContext *)formName.field_2._8_8_,(string *)local_1128);
              AbstractContentContext::cm
                        ((AbstractContentContext *)formName.field_2._8_8_,1.0,0.0,0.0,1.0,297.5,0.0)
              ;
              AbstractContentContext::Do
                        ((AbstractContentContext *)formName.field_2._8_8_,(string *)local_1128);
              AbstractContentContext::Q((AbstractContentContext *)formName.field_2._8_8_);
              copyingContext._4_4_ =
                   PDFWriter::EndPageContentContext
                             ((PDFWriter *)local_ec8,(PageContentContext *)formName.field_2._8_8_);
              if ((copyingContext._4_4_ == eSuccess) &&
                 (copyingContext._4_4_ =
                       PDFWriter::WritePageAndRelease((PDFWriter *)local_ec8,local_1060),
                 copyingContext._4_4_ == eSuccess)) {
                copyingContext._4_4_ = PDFWriter::EndPDF((PDFWriter *)local_ec8);
              }
              std::__cxx11::string::~string((string *)local_1128);
            }
          }
        }
      }
    }
  }
  pPVar1 = local_ed8;
  if (local_ed8 != (PDFDocumentCopyingContext *)0x0) {
    PDFDocumentCopyingContext::~PDFDocumentCopyingContext(local_ed8);
    operator_delete(pPVar1,0xd0);
  }
  bVar4 = copyingContext._4_4_ != eSuccess;
  PDFWriter::~PDFWriter((PDFWriter *)local_ec8);
  return (uint)bVar4;
}

Assistant:

int MergeToPDFForm(int argc, char* argv[])
{
	PDFWriter pdfWriter;
	EStatusCode status;
    PDFDocumentCopyingContext* copyingContext = NULL;
    
	do
	{
		status = pdfWriter.StartPDF(BuildRelativeOutputPath(argv,"MergeToPDFForm.pdf"),
                                    ePDFVersion13,
                                    LogConfiguration(true,true,BuildRelativeOutputPath(argv,"MergeToPDFForm.txt")));
		if(status != PDFHummus::eSuccess)
			break;
        
        
        // in this test we will merge 2 pages into a PDF form, and place it twice, forming a 2X2 design. amazing.
        
		PDFPage* page = new PDFPage();
		page->SetMediaBox(PDFRectangle(0,0,595,842));
        
        
        copyingContext = pdfWriter.CreatePDFCopyingContext(BuildRelativeInputPath(argv,"Linearized.pdf"));
        if(status != PDFHummus::eSuccess)
            break;
        
        // create form for two pages.
        PDFFormXObject* newFormXObject = pdfWriter.StartFormXObject(PDFRectangle(0,0,297.5,842));
        if(!newFormXObject)
        {
            status = PDFHummus::eFailure;
            break;
        }
        
		XObjectContentContext* xobjectContentContext = newFormXObject->GetContentContext();
        
        xobjectContentContext->q();
        xobjectContentContext->cm(0.5,0,0,0.5,0,0);
        status = copyingContext->MergePDFPageToFormXObject(newFormXObject,1);
        if(status != eSuccess)
            break;
        xobjectContentContext->Q();
        
        xobjectContentContext->q();
        xobjectContentContext->cm(0.5,0,0,0.5,0,421);
        status = copyingContext->MergePDFPageToFormXObject(newFormXObject,0);
        if(status != eSuccess)
            break;
        xobjectContentContext->Q();
        
        ObjectIDType formID = newFormXObject->GetObjectID();
        status = pdfWriter.EndFormXObjectAndRelease(newFormXObject);
        if(status != eSuccess)
            break;
        
        // now place it in the page
        PageContentContext* pageContentContext = pdfWriter.StartPageContentContext(page);
        
        
        string formName = page->GetResourcesDictionary().AddFormXObjectMapping(formID);
  
        pageContentContext->q();
        pageContentContext->Do(formName);
        pageContentContext->cm(1,0,0,1,297.5,0);
        pageContentContext->Do(formName);
        pageContentContext->Q();
        
        status = pdfWriter.EndPageContentContext(pageContentContext);
        if(status != eSuccess)
            break;
        
		status = pdfWriter.WritePageAndRelease(page);
		if(status != PDFHummus::eSuccess)
			break;
        
		status = pdfWriter.EndPDF();
		if(status != PDFHummus::eSuccess)
			break;
	}while(false);
    
    delete copyingContext;
	
	return status == eSuccess ? 0:1;
}